

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O2

string * __thiscall Expr::DataTypeStr_abi_cxx11_(string *__return_storage_ptr__,Expr *this,Env *env)

{
  Type *pTVar1;
  Exception *this_00;
  string sStack_38;
  
  pTVar1 = DataType(this,env);
  if (pTVar1 != (Type *)0x0) {
    (*(pTVar1->super_DataDepElement)._vptr_DataDepElement[0xb])(__return_storage_ptr__,pTVar1);
    return __return_storage_ptr__;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x20);
  strfmt_abi_cxx11_(&sStack_38,"cannot find data type for expression `%s\'",
                    (this->orig_)._M_dataplus._M_p);
  Exception::Exception(this_00,&this->super_Object,&sStack_38);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

string Expr::DataTypeStr(Env* env) const
	{
	Type* type = DataType(env);

	if ( ! type )
		{
		throw Exception(this, strfmt("cannot find data type for expression `%s'", orig()));
		}

	return type->DataTypeStr();
	}